

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphic.cpp
# Opt level: O0

void __thiscall graphic::dispatch_updates(graphic *this)

{
  iterator peVar1;
  char *pcVar2;
  ostream *poVar3;
  layout *local_60;
  char *name;
  layout *l;
  element *e;
  iterator __end1;
  iterator __begin1;
  span<mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::element> *local_18;
  span<mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::element> *__range1;
  graphic *this_local;
  
  __range1 = (span<mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::element> *)this;
  ___begin1 = mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::elements
                        ((updates<const_mpt::convertable_*,_mpt::graphic::hint> *)(this + 0x10));
  local_18 = (span<mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::element> *)&__begin1;
  __end1 = mpt::span<mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::element>::begin
                     (local_18);
  peVar1 = mpt::span<mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::element>::end
                     (local_18);
  do {
    if (__end1 == peVar1) {
      return;
    }
    if (__end1->data == (convertable *)0x0) {
      local_60 = (layout *)0x0;
    }
    else {
      local_60 = (layout *)
                 __dynamic_cast(__end1->data,&mpt::convertable::typeinfo,&mpt::layout::typeinfo,0);
    }
    if (local_60 == (layout *)0x0) {
LAB_001034af:
      poVar3 = (ostream *)operator<<((ostream *)&std::cout,&__end1->hint);
      poVar3 = std::operator<<(poVar3,": ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,__end1->data);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      pcVar2 = mpt::layout::alias(local_60);
      if (pcVar2 == (char *)0x0) goto LAB_001034af;
      poVar3 = (ostream *)operator<<((ostream *)&std::cout,&__end1->hint);
      poVar3 = std::operator<<(poVar3,": ");
      pcVar2 = mpt::layout::alias(local_60);
      poVar3 = std::operator<<(poVar3,pcVar2);
      poVar3 = std::operator<<(poVar3,'(');
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,__end1->data);
      poVar3 = std::operator<<(poVar3,')');
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::element::invalidate(__end1);
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

void graphic::dispatch_updates()
{
	for (auto &e : elements()) {
		const mpt::layout *l = dynamic_cast<const mpt::layout *>(e.data);
		const char *name;
		if (l && (name = l->alias())) {
			std::cout << e.hint << ": " << l->alias() << '(' << e.data << ')' << std::endl;
		} else {
			std::cout << e.hint << ": " << e.data << std::endl;
		}
		e.invalidate();
	}
}